

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SaveIniSettingsToDisk(char *ini_filename)

{
  char *data;
  ImFileHandle f_00;
  ImFileHandle f;
  char *ini_data;
  size_t ini_data_size;
  ImGuiContext *g;
  char *ini_filename_local;
  
  ini_data_size = (size_t)GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  if (ini_filename != (char *)0x0) {
    ini_data = (char *)0x0;
    g = (ImGuiContext *)ini_filename;
    data = SaveIniSettingsToMemory((size_t *)&ini_data);
    f_00 = ImFileOpen(&g->Initialized,"wt");
    if (f_00 != (ImFileHandle)0x0) {
      ImFileWrite(data,1,(ImU64)ini_data,f_00);
      ImFileClose(f_00);
    }
  }
  return;
}

Assistant:

void ImGui::SaveIniSettingsToDisk(const char* ini_filename)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    if (!ini_filename)
        return;

    size_t ini_data_size = 0;
    const char* ini_data = SaveIniSettingsToMemory(&ini_data_size);
    ImFileHandle f = ImFileOpen(ini_filename, "wt");
    if (!f)
        return;
    ImFileWrite(ini_data, sizeof(char), ini_data_size, f);
    ImFileClose(f);
}